

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  WirePointer *pWVar6;
  void *pvVar7;
  WirePointer *pWVar8;
  ushort uVar9;
  int iVar10;
  CapTableReader *pCVar11;
  long lVar12;
  CapTableReader *pCVar13;
  SegmentReader *pSVar14;
  long lVar15;
  ushort uVar16;
  SegmentReader *pSVar17;
  uint64_t uVar18;
  int iVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Fault f;
  anon_class_8_1_a7e8901a _kjContextFunc798;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:798:5)>
  _kjContext798;
  StructReader local_1f0;
  void *local_1c0;
  StructReader local_1b8;
  Reader *local_188;
  PointerReader local_180;
  Context local_160;
  Reader **local_118;
  Maybe<capnp::schema::Field::Reader> local_110;
  Maybe<capnp::schema::Node::Reader> local_d8;
  Maybe<capnp::schema::Field::Reader> local_a0;
  Maybe<capnp::schema::Node::Reader> local_68;
  
  local_188 = field;
  kj::_::Debug::Context::Context(&local_160);
  local_160.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_002080e8;
  uVar3 = (field->_reader).dataSize;
  uVar9 = 0;
  uVar16 = 0;
  if (0x1f < uVar3) {
    uVar1 = *(ushort *)((long)(field->_reader).data + 2);
    uVar16 = 0;
    if (uVar1 != 0) {
      uVar16 = ~uVar1;
    }
  }
  uVar4 = (replacement->_reader).dataSize;
  if ((0x1f < uVar4) && (uVar1 = *(ushort *)((long)(replacement->_reader).data + 2), uVar1 != 0)) {
    uVar9 = ~uVar1;
  }
  local_118 = &local_188;
  if (uVar16 != uVar9) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)&local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x325,FAILED,"discriminant == replacementDiscriminant",
               "\"Field discriminant changed.\"",(char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault((Fault *)&local_1f0);
    goto LAB_00199859;
  }
  pvVar5 = (field->_reader).data;
  if (0x4f < uVar3) {
    if (*(short *)((long)pvVar5 + 8) == 1) {
      if (0x4f < uVar4) {
        pvVar7 = (replacement->_reader).data;
        sVar2 = *(short *)((long)pvVar7 + 8);
        if (sVar2 == 1) {
          if (uVar3 < 0xc0) {
            lVar15 = 0;
          }
          else {
            lVar15 = *(long *)((long)pvVar5 + 0x10);
          }
          if (uVar4 < 0xc0) {
            lVar12 = 0;
          }
          else {
            lVar12 = *(long *)((long)pvVar7 + 0x10);
          }
          if (lVar15 != lVar12) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17]>
                      ((Fault *)&local_1f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x349,FAILED,
                       "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                       "\"group id changed\"",(char (*) [17])"group id changed");
            this->compatibility = INCOMPATIBLE;
            kj::_::Debug::Fault::~Fault((Fault *)&local_1f0);
          }
          goto LAB_00199859;
        }
        if (sVar2 != 0) goto LAB_00199859;
      }
      bVar20 = (replacement->_reader).pointerCount < 3;
      local_1b8.data = (replacement->_reader).pointers + 2;
      if (bVar20) {
        local_1b8.data = (WirePointer *)0x0;
      }
      local_1b8.pointers._0_4_ = (replacement->_reader).nestingLimit;
      if (bVar20) {
        uVar21 = 0;
        uVar22 = 0;
        uVar23 = 0;
        uVar24 = 0;
        local_1b8.pointers._0_4_ = 0x7fffffff;
      }
      else {
        uVar21 = *(undefined4 *)&(replacement->_reader).segment;
        uVar22 = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
        uVar23 = *(undefined4 *)&(replacement->_reader).capTable;
        uVar24 = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
      }
      local_1b8.segment = (SegmentReader *)CONCAT44(uVar22,uVar21);
      local_1b8.capTable = (CapTableReader *)CONCAT44(uVar24,uVar23);
      _::PointerReader::getStruct(&local_1f0,(PointerReader *)&local_1b8,(word *)0x0);
      if ((field->_reader).dataSize < 0xc0) {
        uVar18 = 0;
      }
      else {
        uVar18 = *(uint64_t *)((long)(field->_reader).data + 0x10);
      }
      local_d8.ptr.isSet = true;
      local_d8.ptr.field_1.value._reader.segment = (this->replacementNode)._reader.segment;
      local_d8.ptr.field_1.value._reader.capTable = (this->replacementNode)._reader.capTable;
      local_d8.ptr.field_1.value._reader.data = (this->replacementNode)._reader.data;
      local_d8.ptr.field_1.value._reader.pointers = (this->replacementNode)._reader.pointers;
      local_d8.ptr.field_1._32_4_ = (this->replacementNode)._reader.dataSize;
      local_d8.ptr.field_1._36_2_ = (this->replacementNode)._reader.pointerCount;
      local_d8.ptr.field_1._38_2_ = *(undefined2 *)&(this->replacementNode)._reader.field_0x26;
      local_d8.ptr.field_1._40_8_ = *(undefined8 *)&(this->replacementNode)._reader.nestingLimit;
      local_110.ptr.isSet = true;
      local_110.ptr.field_1.value._reader.segment = (replacement->_reader).segment;
      local_110.ptr.field_1.value._reader.capTable = (replacement->_reader).capTable;
      local_110.ptr.field_1.value._reader.data = (replacement->_reader).data;
      local_110.ptr.field_1.value._reader.pointers = (replacement->_reader).pointers;
      local_110.ptr.field_1._32_4_ = (replacement->_reader).dataSize;
      local_110.ptr.field_1._36_2_ = (replacement->_reader).pointerCount;
      local_110.ptr.field_1._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
      local_110.ptr.field_1._40_8_ = *(undefined8 *)&(replacement->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&local_1f0,uVar18,&local_d8,&local_110);
      goto LAB_00199859;
    }
    if (*(short *)((long)pvVar5 + 8) != 0) goto LAB_00199859;
  }
  pSVar17 = (field->_reader).segment;
  pCVar13 = (field->_reader).capTable;
  pWVar6 = (field->_reader).pointers;
  uVar9 = (field->_reader).pointerCount;
  iVar10 = (field->_reader).nestingLimit;
  pvVar7 = (replacement->_reader).data;
  if (0x4f < uVar4) {
    sVar2 = *(short *)((long)pvVar7 + 8);
    if (sVar2 == 1) {
      if (uVar9 < 3) {
        iVar10 = 0x7fffffff;
        pCVar13 = (CapTableReader *)0x0;
        local_1b8.data = (WirePointer *)0x0;
        pSVar17 = (SegmentReader *)0x0;
      }
      else {
        local_1b8.data = pWVar6 + 2;
      }
      local_1b8.segment = pSVar17;
      local_1b8.capTable = pCVar13;
      local_1b8.pointers._0_4_ = iVar10;
      _::PointerReader::getStruct(&local_1f0,(PointerReader *)&local_1b8,(word *)0x0);
      if ((replacement->_reader).dataSize < 0xc0) {
        uVar18 = 0;
      }
      else {
        uVar18 = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
      }
      local_68.ptr.isSet = true;
      local_68.ptr.field_1.value._reader.segment = (this->existingNode)._reader.segment;
      local_68.ptr.field_1.value._reader.capTable = (this->existingNode)._reader.capTable;
      local_68.ptr.field_1.value._reader.data = (this->existingNode)._reader.data;
      local_68.ptr.field_1.value._reader.pointers = (this->existingNode)._reader.pointers;
      local_68.ptr.field_1._32_4_ = (this->existingNode)._reader.dataSize;
      local_68.ptr.field_1._36_2_ = (this->existingNode)._reader.pointerCount;
      local_68.ptr.field_1._38_2_ = *(undefined2 *)&(this->existingNode)._reader.field_0x26;
      local_68.ptr.field_1._40_8_ = *(undefined8 *)&(this->existingNode)._reader.nestingLimit;
      local_a0.ptr.isSet = true;
      local_a0.ptr.field_1.value._reader.segment = (field->_reader).segment;
      local_a0.ptr.field_1.value._reader.capTable = (field->_reader).capTable;
      local_a0.ptr.field_1.value._reader.data = (field->_reader).data;
      local_a0.ptr.field_1.value._reader.pointers = (field->_reader).pointers;
      local_a0.ptr.field_1._32_4_ = (field->_reader).dataSize;
      local_a0.ptr.field_1._36_2_ = (field->_reader).pointerCount;
      local_a0.ptr.field_1._38_2_ = *(undefined2 *)&(field->_reader).field_0x26;
      local_a0.ptr.field_1._40_8_ = *(undefined8 *)&(field->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&local_1f0,uVar18,&local_68,&local_a0);
      goto LAB_00199859;
    }
    if (sVar2 != 0) goto LAB_00199859;
  }
  if (uVar9 < 3) {
    local_1b8.pointers._0_4_ = 0x7fffffff;
    local_1b8.capTable = (CapTableReader *)0x0;
    local_1b8.data = (WirePointer *)0x0;
    local_1b8.segment = (SegmentReader *)0x0;
  }
  else {
    local_1b8.data = pWVar6 + 2;
    local_1b8.capTable = pCVar13;
    local_1b8.segment = pSVar17;
    local_1b8.pointers._0_4_ = iVar10;
  }
  pSVar14 = (replacement->_reader).segment;
  pCVar11 = (replacement->_reader).capTable;
  pWVar8 = (replacement->_reader).pointers;
  uVar16 = (replacement->_reader).pointerCount;
  iVar19 = (replacement->_reader).nestingLimit;
  local_1c0 = pvVar5;
  _::PointerReader::getStruct(&local_1f0,(PointerReader *)&local_1b8,(word *)0x0);
  if (uVar16 < 3) {
    local_180.nestingLimit = 0x7fffffff;
    local_180.capTable = (CapTableReader *)0x0;
    local_180.pointer = (WirePointer *)0x0;
    local_180.segment = (SegmentReader *)0x0;
  }
  else {
    local_180.pointer = pWVar8 + 2;
    local_180.capTable = pCVar11;
    local_180.segment = pSVar14;
    local_180.nestingLimit = iVar19;
  }
  _::PointerReader::getStruct(&local_1b8,&local_180,(word *)0x0);
  checkCompatibility(this,(Reader *)&local_1f0,(Reader *)&local_1b8,NO_UPGRADE_TO_STRUCT);
  if (uVar9 < 4) {
    iVar10 = 0x7fffffff;
    pCVar13 = (CapTableReader *)0x0;
    local_1b8.data = (WirePointer *)0x0;
    pSVar17 = (SegmentReader *)0x0;
  }
  else {
    local_1b8.data = pWVar6 + 3;
  }
  local_1b8.segment = pSVar17;
  local_1b8.capTable = pCVar13;
  local_1b8.pointers._0_4_ = iVar10;
  _::PointerReader::getStruct(&local_1f0,(PointerReader *)&local_1b8,(word *)0x0);
  if (uVar16 < 4) {
    iVar19 = 0x7fffffff;
    pCVar11 = (CapTableReader *)0x0;
    local_180.pointer = (WirePointer *)0x0;
    pSVar14 = (SegmentReader *)0x0;
  }
  else {
    local_180.pointer = pWVar8 + 3;
  }
  local_180.segment = pSVar14;
  local_180.capTable = pCVar11;
  local_180.nestingLimit = iVar19;
  _::PointerReader::getStruct(&local_1b8,&local_180,(word *)0x0);
  checkDefaultCompatibility(this,(Reader *)&local_1f0,(Reader *)&local_1b8);
  iVar19 = 0;
  iVar10 = 0;
  if (0x3f < uVar3) {
    iVar10 = *(int *)((long)local_1c0 + 4);
  }
  if (0x3f < uVar4) {
    iVar19 = *(int *)((long)pvVar7 + 4);
  }
  if (iVar10 != iVar19) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
              ((Fault *)&local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x335,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
               "\"field position changed\"",(char (*) [23])"field position changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault((Fault *)&local_1f0);
  }
LAB_00199859:
  kj::_::Debug::Context::~Context(&local_160);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }